

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::iteratorAccessTest<false>(ViewTest *this)

{
  int *piVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar6;
  reference piVar7;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar8;
  logic_error *plVar9;
  code *pcVar10;
  int iVar11;
  ulong uVar12;
  undefined *puVar13;
  long lVar14;
  iterator it;
  reverse_iterator it_1;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_108;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_d8;
  undefined1 local_a8 [16];
  size_t *local_98;
  size_t local_80;
  size_t local_78;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_68;
  
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 0x18;
  piVar1 = this->data_;
  local_a8._0_8_ = piVar1;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_108);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.index_ = 0;
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.view_ = (view_pointer)0x0;
  local_108.pointer_ = (pointer)0x0;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_108);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_d8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,0);
  local_108.index_ = local_d8.index_;
  local_108.view_ = local_d8.view_;
  local_108.pointer_ = local_d8.pointer_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_108.coordinates_,&local_d8.coordinates_);
  if (local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar14 = 1;
  do {
    if ((local_108.view_ == (view_pointer)0x0) ||
       (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
      pcVar10 = std::runtime_error::~runtime_error;
      puVar13 = &std::runtime_error::typeinfo;
LAB_001a5e26:
      __cxa_throw(plVar9,puVar13,pcVar10);
    }
    if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar9,"test failed.");
      pcVar10 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
      goto LAB_001a5e26;
    }
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_108);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x19);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_d8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,local_78);
  if (local_108.view_ == (view_pointer)0x0) {
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
  }
  else {
    if (local_d8.view_ == local_108.view_) {
      if (local_108.index_ == local_d8.index_) {
        if (local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                           (&local_108);
        if ((pIVar6->view_ == (view_pointer)0x0) ||
           ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          pcVar10 = std::runtime_error::~runtime_error;
          puVar13 = &std::runtime_error::typeinfo;
LAB_001a617e:
          __cxa_throw(plVar9,puVar13,pcVar10);
        }
        if (*pIVar6->pointer_ != 0x17) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar13 = &std::logic_error::typeinfo;
          goto LAB_001a617e;
        }
        if (local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        operator_delete(local_98,local_80 * 0x18);
        operator_delete(_Var5._M_current,8);
        _Var5._M_current = (unsigned_long *)operator_new(8);
        *_Var5._M_current = 0x18;
        local_a8._0_8_ = piVar1;
        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var5,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(_Var5._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                   (allocator_type *)&local_108);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
        std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
        reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                          *)&local_d8);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                  (&local_108,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,local_78)
        ;
        std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
        reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                          *)&local_68,&local_108);
        if (local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_d8.view_ = local_68.view_;
        local_d8.pointer_ = local_68.pointer_;
        local_d8.index_ = local_68.index_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_d8.coordinates_,&local_68.coordinates_);
        if (local_68.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar12 = 0x17;
        do {
          piVar7 = std::
                   reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
                   operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                              *)&local_d8);
          iVar11 = (int)uVar12;
          if (*piVar7 != piVar1[uVar12]) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&local_d8);
          uVar12 = (ulong)(iVar11 - 1);
        } while (iVar11 != 0);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                  (&local_108,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,0);
        std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
        reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                          *)&local_68,&local_108);
        if (local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar4 = std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                 *)&local_d8,
                                (reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                 *)&local_68);
        if (!bVar4) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        if (local_68.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_d8);
        piVar7 = std::
                 reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
                 operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                            *)&local_d8);
        if (*piVar7 != 0) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        if (local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        operator_delete(local_98,local_80 * 0x18);
        operator_delete(_Var5._M_current,8);
        _Var5._M_current = (unsigned_long *)operator_new(8);
        *_Var5._M_current = 0x18;
        local_a8._0_8_ = piVar1;
        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var5,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(_Var5._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                   (allocator_type *)&local_108);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_108.index_ = 0;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.view_ = (view_pointer)0x0;
        local_108.pointer_ = (pointer)0x0;
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                  (&local_68,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,0);
        local_d8.view_ = local_68.view_;
        local_d8.pointer_ = local_68.pointer_;
        local_d8.index_ = local_68.index_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_d8.coordinates_,&local_68.coordinates_);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_d8);
        puVar3 = local_108.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar2 = local_108.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_108.index_ = local_d8.index_;
        local_108.view_ = local_d8.view_;
        local_108.pointer_ = local_d8.pointer_;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)puVar3 - (long)puVar2);
          if (local_d8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_68.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar14 = 1;
        do {
          if ((local_108.view_ == (view_pointer)0x0) ||
             (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
            pcVar10 = std::runtime_error::~runtime_error;
            puVar13 = &std::runtime_error::typeinfo;
LAB_001a5e8a:
            __cxa_throw(plVar9,puVar13,pcVar10);
          }
          if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            pcVar10 = std::logic_error::~logic_error;
            puVar13 = &std::logic_error::typeinfo;
            goto LAB_001a5e8a;
          }
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x19);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                  (&local_d8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,local_78);
        if (local_108.view_ == (view_pointer)0x0) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
        }
        else {
          if (local_d8.view_ == local_108.view_) {
            if (local_108.index_ == local_d8.index_) {
              if (local_d8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108)
              ;
              if ((pIVar8->view_ == (view_pointer)0x0) ||
                 ((pIVar8->view_->geometry_).size_ <= pIVar8->index_)) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
                pcVar10 = std::runtime_error::~runtime_error;
                puVar13 = &std::runtime_error::typeinfo;
LAB_001a6290:
                __cxa_throw(plVar9,puVar13,pcVar10);
              }
              if (*pIVar8->pointer_ != 0x17) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                pcVar10 = std::logic_error::~logic_error;
                puVar13 = &std::logic_error::typeinfo;
                goto LAB_001a6290;
              }
              if (local_108.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_98,local_80 * 0x18);
              operator_delete(_Var5._M_current,8);
              _Var5._M_current = (unsigned_long *)operator_new(0x10);
              *_Var5._M_current = 6;
              _Var5._M_current[1] = 4;
              local_a8._0_8_ = piVar1;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var5,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_108);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_108.index_ = 0;
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_108.view_ = (view_pointer)0x0;
              local_108.pointer_ = (pointer)0x0;
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        (&local_108);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_d8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,0);
              local_108.index_ = local_d8.index_;
              local_108.view_ = local_d8.view_;
              local_108.pointer_ = local_d8.pointer_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (&local_108.coordinates_,&local_d8.coordinates_);
              if (local_d8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar14 = 1;
              do {
                if ((local_108.view_ == (view_pointer)0x0) ||
                   (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
                  pcVar10 = std::runtime_error::~runtime_error;
                  puVar13 = &std::runtime_error::typeinfo;
LAB_001a5ebc:
                  __cxa_throw(plVar9,puVar13,pcVar10);
                }
                if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar9,"test failed.");
                  pcVar10 = std::logic_error::~logic_error;
                  puVar13 = &std::logic_error::typeinfo;
                  goto LAB_001a5ebc;
                }
                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_108)
                ;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x19);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_d8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,
                         local_78);
              if (local_108.view_ == (view_pointer)0x0) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
              }
              else {
                if (local_d8.view_ == local_108.view_) {
                  if (local_108.index_ == local_d8.index_) {
                    if (local_d8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    pIVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                             operator--(&local_108);
                    if ((pIVar6->view_ == (view_pointer)0x0) ||
                       ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.")
                      ;
                      pcVar10 = std::runtime_error::~runtime_error;
                      puVar13 = &std::runtime_error::typeinfo;
LAB_001a633e:
                      __cxa_throw(plVar9,puVar13,pcVar10);
                    }
                    if (*pIVar6->pointer_ != 0x17) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      pcVar10 = std::logic_error::~logic_error;
                      puVar13 = &std::logic_error::typeinfo;
                      goto LAB_001a633e;
                    }
                    if (local_108.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    operator_delete(local_98,local_80 * 0x18);
                    operator_delete(_Var5._M_current,0x10);
                    _Var5._M_current = (unsigned_long *)operator_new(0x10);
                    *_Var5._M_current = 6;
                    _Var5._M_current[1] = 4;
                    local_a8._0_8_ = piVar1;
                    andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                    Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var5,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                               (allocator_type *)&local_108);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                    std::
                    reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                    ::reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                        *)&local_d8);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                              (&local_108,
                               (View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,local_78
                              );
                    std::
                    reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                    ::reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                        *)&local_68,&local_108);
                    if (local_108.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    local_d8.view_ = local_68.view_;
                    local_d8.pointer_ = local_68.pointer_;
                    local_d8.index_ = local_68.index_;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                              (&local_d8.coordinates_,&local_68.coordinates_);
                    if (local_68.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_68.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_68.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_68.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar12 = 0x17;
                    do {
                      piVar7 = std::
                               reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                               ::operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                            *)&local_d8);
                      iVar11 = (int)uVar12;
                      if (*piVar7 != piVar1[uVar12]) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                                (&local_d8);
                      uVar12 = (ulong)(iVar11 - 1);
                    } while (iVar11 != 0);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                              (&local_108,
                               (View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,0);
                    std::
                    reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                    ::reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                        *)&local_68,&local_108);
                    if (local_108.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    bVar4 = std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                             *)&local_d8,
                                            (reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                             *)&local_68);
                    if (!bVar4) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error)
                      ;
                    }
                    if (local_68.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_68.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_68.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_68.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                              (&local_d8);
                    piVar7 = std::
                             reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                             ::operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                          *)&local_d8);
                    if (*piVar7 != 0) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error)
                      ;
                    }
                    if (local_d8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    operator_delete(local_98,local_80 * 0x18);
                    operator_delete(_Var5._M_current,0x10);
                    _Var5._M_current = (unsigned_long *)operator_new(0x10);
                    *_Var5._M_current = 6;
                    _Var5._M_current[1] = 4;
                    local_a8._0_8_ = piVar1;
                    andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                    Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var5,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                               (allocator_type *)&local_108);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_108.index_ = 0;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_108.view_ = (view_pointer)0x0;
                    local_108.pointer_ = (pointer)0x0;
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                              (&local_68,
                               (View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,0);
                    local_d8.view_ = local_68.view_;
                    local_d8.pointer_ = local_68.pointer_;
                    local_d8.index_ = local_68.index_;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              (&local_d8.coordinates_,&local_68.coordinates_);
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_d8);
                    puVar3 = local_108.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    puVar2 = local_108.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    local_108.index_ = local_d8.index_;
                    local_108.view_ = local_d8.view_;
                    local_108.pointer_ = local_d8.pointer_;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         local_d8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_d8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         local_d8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                    local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if (puVar2 != (pointer)0x0) {
                      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
                      if (local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_d8.coordinates_.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_d8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_d8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    if (local_68.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_68.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_68.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_68.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    lVar14 = 1;
                    do {
                      if ((local_108.view_ == (view_pointer)0x0) ||
                         (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar9,"Assertion failed.");
                        pcVar10 = std::runtime_error::~runtime_error;
                        puVar13 = &std::runtime_error::typeinfo;
LAB_001a5f20:
                        __cxa_throw(plVar9,puVar13,pcVar10);
                      }
                      if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        pcVar10 = std::logic_error::~logic_error;
                        puVar13 = &std::logic_error::typeinfo;
                        goto LAB_001a5f20;
                      }
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108);
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 0x19);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                              (&local_d8,
                               (View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,local_78
                              );
                    if (local_108.view_ == (view_pointer)0x0) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.")
                      ;
                    }
                    else {
                      if (local_d8.view_ == local_108.view_) {
                        if (local_108.index_ == local_d8.index_) {
                          if (local_d8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_d8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          pIVar8 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                   operator--((Iterator<int,_true,_std::allocator<unsigned_long>_> *
                                              )&local_108);
                          if ((pIVar8->view_ == (view_pointer)0x0) ||
                             ((pIVar8->view_->geometry_).size_ <= pIVar8->index_)) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar9,"Assertion failed.");
                            pcVar10 = std::runtime_error::~runtime_error;
                            puVar13 = &std::runtime_error::typeinfo;
LAB_001a6450:
                            __cxa_throw(plVar9,puVar13,pcVar10);
                          }
                          if (*pIVar8->pointer_ != 0x17) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar9,"test failed.");
                            pcVar10 = std::logic_error::~logic_error;
                            puVar13 = &std::logic_error::typeinfo;
                            goto LAB_001a6450;
                          }
                          if (local_108.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_108.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          operator_delete(local_98,local_80 * 0x18);
                          operator_delete(_Var5._M_current,0x10);
                          _Var5._M_current = (unsigned_long *)operator_new(0x18);
                          *_Var5._M_current = 3;
                          _Var5._M_current[1] = 4;
                          _Var5._M_current[2] = 2;
                          local_a8._0_8_ = piVar1;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var5
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var5._M_current + 3),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_108);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_108.index_ = 0;
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_108.view_ = (view_pointer)0x0;
                          local_108.pointer_ = (pointer)0x0;
                          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                          testInvariant(&local_108);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_d8,
                                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,0)
                          ;
                          local_108.index_ = local_d8.index_;
                          local_108.view_ = local_d8.view_;
                          local_108.pointer_ = local_d8.pointer_;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                    (&local_108.coordinates_,&local_d8.coordinates_);
                          if (local_d8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_d8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          lVar14 = 1;
                          do {
                            if ((local_108.view_ == (view_pointer)0x0) ||
                               (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar9,"Assertion failed.");
                              pcVar10 = std::runtime_error::~runtime_error;
                              puVar13 = &std::runtime_error::typeinfo;
LAB_001a5f52:
                              __cxa_throw(plVar9,puVar13,pcVar10);
                            }
                            if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar9,"test failed.");
                              pcVar10 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
                              goto LAB_001a5f52;
                            }
                            andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                                      (&local_108);
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != 0x19);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
                          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_d8,
                                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,
                                     local_78);
                          if (local_108.view_ == (view_pointer)0x0) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar9,"Assertion failed.");
                          }
                          else {
                            if (local_d8.view_ == local_108.view_) {
                              if (local_108.index_ == local_d8.index_) {
                                if (local_d8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                pIVar6 = andres::
                                         Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                         operator--(&local_108);
                                if ((pIVar6->view_ == (view_pointer)0x0) ||
                                   ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar9,"Assertion failed.");
                                  pcVar10 = std::runtime_error::~runtime_error;
                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001a64fe:
                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                }
                                if (*pIVar6->pointer_ != 0x17) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar9,"test failed.");
                                  pcVar10 = std::logic_error::~logic_error;
                                  puVar13 = &std::logic_error::typeinfo;
                                  goto LAB_001a64fe;
                                }
                                if (local_108.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                operator_delete(local_98,local_80 * 0x18);
                                operator_delete(_Var5._M_current,0x18);
                                _Var5._M_current = (unsigned_long *)operator_new(0x18);
                                *_Var5._M_current = 3;
                                _Var5._M_current[1] = 4;
                                _Var5._M_current[2] = 2;
                                local_a8._0_8_ = piVar1;
                                andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8)
                                           ,_Var5,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&andres::defaultOrder,
                                           &andres::defaultOrder,(allocator_type *)&local_108);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                std::
                                reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                ::reverse_iterator((
                                                  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator(&local_108,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_a8,local_78);
                                std::
                                reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                ::reverse_iterator((
                                                  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                                  *)&local_68,&local_108);
                                if (local_108.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                local_d8.view_ = local_68.view_;
                                local_d8.pointer_ = local_68.pointer_;
                                local_d8.index_ = local_68.index_;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator=(&local_d8.coordinates_,&local_68.coordinates_);
                                if (local_68.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_68.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_68.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_68.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                uVar12 = 0x17;
                                do {
                                  piVar7 = std::
                                           reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                           ::operator*((
                                                  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8);
                                  iVar11 = (int)uVar12;
                                  if (*piVar7 != piVar1[uVar12]) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  operator--(&local_d8);
                                  uVar12 = (ulong)(iVar11 - 1);
                                } while (iVar11 != 0);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator(&local_108,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_a8,0);
                                std::
                                reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                ::reverse_iterator((
                                                  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                                  *)&local_68,&local_108);
                                if (local_108.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                bVar4 = std::operator==((
                                                  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8,
                                                  (
                                                  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                                  *)&local_68);
                                if (!bVar4) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar9,"test failed.");
                                  __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                if (local_68.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_68.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_68.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_68.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                operator++(&local_d8);
                                piVar7 = std::
                                         reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                         ::operator*((
                                                  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8);
                                if (*piVar7 != 0) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar9,"test failed.");
                                  __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                if (local_d8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                operator_delete(local_98,local_80 * 0x18);
                                operator_delete(_Var5._M_current,0x18);
                                _Var5._M_current = (unsigned_long *)operator_new(0x18);
                                *_Var5._M_current = 3;
                                _Var5._M_current[1] = 4;
                                _Var5._M_current[2] = 2;
                                local_a8._0_8_ = piVar1;
                                andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8)
                                           ,_Var5,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&andres::defaultOrder,
                                           &andres::defaultOrder,(allocator_type *)&local_108);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                local_108.index_ = 0;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_108.view_ = (view_pointer)0x0;
                                local_108.pointer_ = (pointer)0x0;
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_> *
                                              )&local_108);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator(&local_68,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_a8,0);
                                local_d8.view_ = local_68.view_;
                                local_d8.pointer_ = local_68.pointer_;
                                local_d8.index_ = local_68.index_;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          (&local_d8.coordinates_,&local_68.coordinates_);
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_> *
                                              )&local_d8);
                                puVar3 = local_108.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                puVar2 = local_108.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                local_108.index_ = local_d8.index_;
                                local_108.view_ = local_d8.view_;
                                local_108.pointer_ = local_d8.pointer_;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     local_d8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_d8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage =
                                     local_d8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                if (puVar2 != (pointer)0x0) {
                                  operator_delete(puVar2,(long)puVar3 - (long)puVar2);
                                  if (local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_d8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                }
                                if (local_68.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_68.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_68.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_68.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                lVar14 = 1;
                                do {
                                  if ((local_108.view_ == (view_pointer)0x0) ||
                                     (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar9,"Assertion failed.");
                                    pcVar10 = std::runtime_error::~runtime_error;
                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001a5fb6:
                                    __cxa_throw(plVar9,puVar13,pcVar10);
                                  }
                                  if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    pcVar10 = std::logic_error::~logic_error;
                                    puVar13 = &std::logic_error::typeinfo;
                                    goto LAB_001a5fb6;
                                  }
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  operator++((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                             &local_108);
                                  lVar14 = lVar14 + 1;
                                } while (lVar14 != 0x19);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator(&local_d8,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_a8,local_78);
                                if (local_108.view_ == (view_pointer)0x0) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar9,"Assertion failed.");
                                }
                                else {
                                  if (local_d8.view_ == local_108.view_) {
                                    if (local_108.index_ == local_d8.index_) {
                                      if (local_d8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      pIVar8 = andres::
                                               Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                               operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_108);
                                      if ((pIVar8->view_ == (view_pointer)0x0) ||
                                         ((pIVar8->view_->geometry_).size_ <= pIVar8->index_)) {
                                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar9,"Assertion failed.");
                                        pcVar10 = std::runtime_error::~runtime_error;
                                        puVar13 = &std::runtime_error::typeinfo;
                                      }
                                      else {
                                        if (*pIVar8->pointer_ == 0x17) {
                                          if (local_108.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_108.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          operator_delete(local_98,local_80 * 0x18);
                                          operator_delete(_Var5._M_current,0x18);
                                          return;
                                        }
                                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar9,"test failed.");
                                        pcVar10 = std::logic_error::~logic_error;
                                        puVar13 = &std::logic_error::typeinfo;
                                      }
                                      __cxa_throw(plVar9,puVar13,pcVar10);
                                    }
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    pcVar10 = std::logic_error::~logic_error;
                                    puVar13 = &std::logic_error::typeinfo;
                                    goto LAB_001a65de;
                                  }
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar9,"Assertion failed.");
                                }
                                pcVar10 = std::runtime_error::~runtime_error;
                                puVar13 = &std::runtime_error::typeinfo;
LAB_001a65de:
                                __cxa_throw(plVar9,puVar13,pcVar10);
                              }
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar9,"test failed.");
                              pcVar10 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
                              goto LAB_001a64cc;
                            }
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar9,"Assertion failed.");
                          }
                          pcVar10 = std::runtime_error::~runtime_error;
                          puVar13 = &std::runtime_error::typeinfo;
LAB_001a64cc:
                          __cxa_throw(plVar9,puVar13,pcVar10);
                        }
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        pcVar10 = std::logic_error::~logic_error;
                        puVar13 = &std::logic_error::typeinfo;
                        goto LAB_001a641e;
                      }
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.")
                      ;
                    }
                    pcVar10 = std::runtime_error::~runtime_error;
                    puVar13 = &std::runtime_error::typeinfo;
LAB_001a641e:
                    __cxa_throw(plVar9,puVar13,pcVar10);
                  }
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar9,"test failed.");
                  pcVar10 = std::logic_error::~logic_error;
                  puVar13 = &std::logic_error::typeinfo;
                  goto LAB_001a630c;
                }
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
              }
              pcVar10 = std::runtime_error::~runtime_error;
              puVar13 = &std::runtime_error::typeinfo;
LAB_001a630c:
              __cxa_throw(plVar9,puVar13,pcVar10);
            }
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            pcVar10 = std::logic_error::~logic_error;
            puVar13 = &std::logic_error::typeinfo;
            goto LAB_001a625e;
          }
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
        }
        pcVar10 = std::runtime_error::~runtime_error;
        puVar13 = &std::runtime_error::typeinfo;
LAB_001a625e:
        __cxa_throw(plVar9,puVar13,pcVar10);
      }
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar9,"test failed.");
      pcVar10 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
      goto LAB_001a614c;
    }
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
  }
  pcVar10 = std::runtime_error::~runtime_error;
  puVar13 = &std::runtime_error::typeinfo;
LAB_001a614c:
  __cxa_throw(plVar9,puVar13,pcVar10);
}

Assistant:

void ViewTest::iteratorAccessTest(){
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 3D
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // cosnt
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
}